

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_chunk_append(uchar **out,size_t *outsize,uchar *chunk)

{
  ulong uVar1;
  uint uVar2;
  uchar *puVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar2 = lodepng_read32bitInt(chunk);
  uVar6 = (ulong)uVar2 + 0xc;
  uVar1 = *outsize;
  if (CARRY8(uVar6,uVar1)) {
    uVar2 = 0x4d;
  }
  else {
    puVar3 = (uchar *)realloc(*out,uVar6 + uVar1);
    if (puVar3 == (uchar *)0x0) {
      uVar2 = 0x53;
    }
    else {
      *out = puVar3;
      *outsize = uVar6 + uVar1;
      uVar2 = 0;
      for (uVar4 = 0; uVar5 = (ulong)uVar4, uVar6 != uVar5; uVar4 = uVar4 + 1) {
        puVar3[uVar5 + uVar1] = chunk[uVar5];
      }
    }
  }
  return uVar2;
}

Assistant:

unsigned lodepng_chunk_append(unsigned char** out, size_t* outsize, const unsigned char* chunk) {
  unsigned i;
  size_t total_chunk_length, new_length;
  unsigned char* chunk_start, * new_buffer;

  if (lodepng_addofl(lodepng_chunk_length(chunk), 12, &total_chunk_length)) return 77;
  if (lodepng_addofl(*outsize, total_chunk_length, &new_length)) return 77;

  new_buffer = (unsigned char*)lodepng_realloc(*out, new_length);
  if (!new_buffer) return 83; /*alloc fail*/
  (*out) = new_buffer;
  (*outsize) = new_length;
  chunk_start = &(*out)[new_length - total_chunk_length];

  for (i = 0; i != total_chunk_length; ++i) chunk_start[i] = chunk[i];

  return 0;
}